

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O0

double __thiscall leveldb::Histogram::Percentile(Histogram *this,double p)

{
  double dVar1;
  double dVar2;
  double local_78;
  double local_68;
  double r;
  double pos;
  double right_sum;
  double left_sum;
  double right_point;
  double left_point;
  double dStack_30;
  int b;
  double sum;
  double threshold;
  double p_local;
  Histogram *this_local;
  
  dVar1 = this->num_ * (p / 100.0);
  dStack_30 = 0.0;
  left_point._4_4_ = 0;
  while( true ) {
    if (0x99 < left_point._4_4_) {
      return this->max_;
    }
    dStack_30 = this->buckets_[left_point._4_4_] + dStack_30;
    if (dVar1 <= dStack_30) break;
    left_point._4_4_ = left_point._4_4_ + 1;
  }
  if (left_point._4_4_ == 0) {
    local_78 = 0.0;
  }
  else {
    local_78 = *(double *)(kBucketLimit + (long)(left_point._4_4_ + -1) * 8);
  }
  dVar2 = dStack_30 - this->buckets_[left_point._4_4_];
  local_68 = (*(double *)(kBucketLimit + (long)left_point._4_4_ * 8) - local_78) *
             ((dVar1 - dVar2) / (dStack_30 - dVar2)) + local_78;
  if (local_68 < this->min_) {
    local_68 = this->min_;
  }
  if (this->max_ <= local_68 && local_68 != this->max_) {
    local_68 = this->max_;
  }
  return local_68;
}

Assistant:

double Histogram::Percentile(double p) const {
  double threshold = num_ * (p / 100.0);
  double sum = 0;
  for (int b = 0; b < kNumBuckets; b++) {
    sum += buckets_[b];
    if (sum >= threshold) {
      // Scale linearly within this bucket
      double left_point = (b == 0) ? 0 : kBucketLimit[b - 1];
      double right_point = kBucketLimit[b];
      double left_sum = sum - buckets_[b];
      double right_sum = sum;
      double pos = (threshold - left_sum) / (right_sum - left_sum);
      double r = left_point + (right_point - left_point) * pos;
      if (r < min_) r = min_;
      if (r > max_) r = max_;
      return r;
    }
  }
  return max_;
}